

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallExportGenerator.cxx
# Opt level: O2

string * __thiscall
cmInstallExportGenerator::TempDirCalculate_abi_cxx11_
          (string *__return_storage_ptr__,cmInstallExportGenerator *this)

{
  string *psVar1;
  cmAlphaNum local_70;
  cmAlphaNum local_40;
  
  psVar1 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_(this->LocalGenerator);
  local_70.View_._M_str = (psVar1->_M_dataplus)._M_p;
  local_70.View_._M_len = psVar1->_M_string_length;
  local_40.View_._M_len = 0x12;
  local_40.View_._M_str = "/CMakeFiles/Export";
  cmStrCat<>(__return_storage_ptr__,&local_70,&local_40);
  if ((this->super_cmInstallGenerator).Destination._M_string_length != 0) {
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
    cmSystemTools::ComputeStringMD5
              ((string *)&local_70,&(this->super_cmInstallGenerator).Destination);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_70);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmInstallExportGenerator::TempDirCalculate() const
{
  // Choose a temporary directory in which to generate the import
  // files to be installed.
  std::string path = cmStrCat(
    this->LocalGenerator->GetCurrentBinaryDirectory(), "/CMakeFiles/Export");
  if (this->Destination.empty()) {
    return path;
  }

#ifndef CMAKE_BOOTSTRAP
  path += '/';
  // Replace the destination path with a hash to keep it short.
  path += cmSystemTools::ComputeStringMD5(this->Destination);
#endif

  return path;
}